

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_grouping.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::Grouper::setLocaleData
          (Grouper *this,ParsedPatternInfo *patternInfo,Locale *locale)

{
  int16_t iVar1;
  int32_t iVar2;
  short local_24;
  short local_22;
  int16_t grouping3;
  int16_t grouping2;
  int16_t grouping1;
  Locale *locale_local;
  ParsedPatternInfo *patternInfo_local;
  Grouper *this_local;
  
  if ((this->fGrouping1 == -2) || (this->fGrouping2 == -4)) {
    local_22 = (short)(patternInfo->positive).groupingSizes;
    local_24 = (short)((patternInfo->positive).groupingSizes >> 0x10);
    if ((local_24 == -1) && (local_22 = -1, this->fGrouping1 == -4)) {
      local_22 = 3;
    }
    if ((short)((patternInfo->positive).groupingSizes >> 0x20) == -1) {
      local_24 = local_22;
    }
    if (this->fMinGrouping == -2) {
      iVar1 = anon_unknown.dwarf_12ec89::getMinGroupingForLocale(locale);
      this->fMinGrouping = iVar1;
    }
    else if (this->fMinGrouping == -3) {
      iVar1 = anon_unknown.dwarf_12ec89::getMinGroupingForLocale(locale);
      iVar2 = uprv_max_63(2,(int)iVar1);
      this->fMinGrouping = (int16_t)iVar2;
    }
    this->fGrouping1 = local_22;
    this->fGrouping2 = local_24;
  }
  return;
}

Assistant:

void Grouper::setLocaleData(const impl::ParsedPatternInfo &patternInfo, const Locale& locale) {
    if (fGrouping1 != -2 && fGrouping2 != -4) {
        return;
    }
    auto grouping1 = static_cast<int16_t> (patternInfo.positive.groupingSizes & 0xffff);
    auto grouping2 = static_cast<int16_t> ((patternInfo.positive.groupingSizes >> 16) & 0xffff);
    auto grouping3 = static_cast<int16_t> ((patternInfo.positive.groupingSizes >> 32) & 0xffff);
    if (grouping2 == -1) {
        grouping1 = fGrouping1 == -4 ? (short) 3 : (short) -1;
    }
    if (grouping3 == -1) {
        grouping2 = grouping1;
    }
    if (fMinGrouping == -2) {
        fMinGrouping = getMinGroupingForLocale(locale);
    } else if (fMinGrouping == -3) {
        fMinGrouping = static_cast<int16_t>(uprv_max(2, getMinGroupingForLocale(locale)));
    } else {
        // leave fMinGrouping alone
    }
    fGrouping1 = grouping1;
    fGrouping2 = grouping2;
}